

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall ExprWriterTest_WriteIfExpr_Test::TestBody(ExprWriterTest_WriteIfExpr_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args;
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *this_01;
  bool bVar1;
  Impl *pIVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *pBVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  char *pcVar6;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  string local_80;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *local_50;
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *local_48;
  Impl *local_40;
  Impl *local_38;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  pIVar2 = (Impl *)operator_new__(0x80);
  pIVar2->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2;
  *(undefined8 *)(pIVar2 + 2) = 0;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  pBVar3 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)operator_new__(0x80);
  *(Kind *)&(pBVar3->super_ExprBase).impl_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)pBVar3;
  pBVar3[1].super_ExprBase.impl_ = (Impl *)0x3ff0000000000000;
  local_88.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_88);
  pIVar4 = (Impl *)operator_new__(0x40);
  pIVar4->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  pIVar4[1].kind_ = UNKNOWN;
  local_88.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_88);
  pIVar5 = (Impl *)operator_new__(0xc0);
  pIVar5->kind_ = EQ;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)(pIVar5 + 2) = pIVar4;
  *(Impl **)(pIVar5 + 4) = pIVar2;
  local_88.data_ = (AssertHelperData *)0x0;
  local_48 = (vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_88);
  local_38 = (Impl *)operator_new__(0x100);
  local_38->kind_ = IF;
  args = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
         (this->super_ExprWriterTest).super_ExprFactory.exprs_.
         super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  args[-1].super_ExprBase.impl_ = local_38;
  *(Impl **)(local_38 + 2) = pIVar5;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_38 + 4) = pBVar3;
  *(Impl **)(local_38 + 6) = pIVar2;
  local_50 = pBVar3;
  local_40 = pIVar2;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_80,(fmt *)0x1674c5,(CStringRef)&local_38,args);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            (local_60,"\"if x1 = 0 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n1, n0)))"
             ,(char (*) [17])"if x1 = 0 then 1",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x11f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_80._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_01 = local_48;
  local_88.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_48,(Impl **)&local_88);
  pIVar4 = (Impl *)operator_new__(0x40);
  pIVar4->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  pIVar4[1].kind_ = UNKNOWN;
  local_88.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_01,(Impl **)&local_88);
  pIVar5 = (Impl *)operator_new__(0xc0);
  pIVar2 = local_40;
  pIVar5->kind_ = EQ;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)(pIVar5 + 2) = pIVar4;
  *(Impl **)(pIVar5 + 4) = local_40;
  local_88.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_01,(Impl **)&local_88);
  local_38 = (Impl *)operator_new__(0x100);
  local_38->kind_ = IF;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_38;
  *(Impl **)(local_38 + 2) = pIVar5;
  *(Impl **)(local_38 + 4) = pIVar2;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_38 + 6) = local_50;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_80,(fmt *)0x1674c5,(CStringRef)&local_38,local_50);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            (local_60,"\"if x1 = 0 then 0 else 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n0, n1)))"
             ,(char (*) [24])"if x1 = 0 then 0 else 1",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x121,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_80._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteIfExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if x1 = 0 then 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n1, n0));
  CHECK_WRITE("if x1 = 0 then 0 else 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n0, n1));
}